

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::LRNParameter::MergePartialFromCodedStream(LRNParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  float *pfVar4;
  bool bVar5;
  uint32 uVar6;
  int64 iVar7;
  int iVar8;
  UnknownFieldSet *pUVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  float local_3c;
  float local_38;
  float local_34;
  
  this_00 = &this->_internal_metadata_;
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b0779;
      input->buffer_ = pbVar2 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b0779:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar12 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar6 | uVar12;
    }
    uVar11 = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_003b07cb_default;
    cVar10 = (char)uVar12;
    switch((uint)(uVar12 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar10 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar6 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->local_size_ = (uint)bVar1;
          input->buffer_ = pbVar2 + 1;
          goto LAB_003b081f;
        }
      }
      else {
        uVar6 = 0;
      }
      iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
      this->local_size_ = (uint32)iVar7;
      iVar8 = 6;
      if (-1 < iVar7) goto LAB_003b081f;
      goto LAB_003b0821;
    case 2:
      if (cVar10 != '\x15') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_3c);
        if (!bVar5) {
LAB_003b0a17:
          iVar8 = 6;
          goto LAB_003b0821;
        }
      }
      else {
        local_3c = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->alpha_ = local_3c;
      goto LAB_003b081f;
    case 3:
      if (cVar10 == '\x1d') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        pfVar4 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_38);
          if (!bVar5) goto LAB_003b0a17;
        }
        else {
          local_38 = *pfVar4;
          input->buffer_ = (uint8 *)(pfVar4 + 1);
        }
        this->beta_ = local_38;
        goto LAB_003b081f;
      }
      break;
    case 4:
      if (cVar10 == ' ') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar12 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b098b;
          input->buffer_ = pbVar2 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_003b098b:
          uVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar12;
        }
        iVar8 = 6;
        if (bVar5) {
          uVar11 = (uint)uVar12;
          if (uVar11 < 2) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
            this->norm_region_ = uVar11;
          }
          else {
            pvVar3 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar3 & 1) == 0) {
              pUVar9 = google::protobuf::internal::
                       InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ::mutable_unknown_fields_slow
                                 (&this_00->
                                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                 );
            }
            else {
              pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
            }
            iVar8 = 4;
LAB_003b0a68:
            google::protobuf::UnknownFieldSet::AddVarint(pUVar9,iVar8,(long)(int)uVar11);
          }
LAB_003b0a6e:
          iVar8 = 0;
        }
LAB_003b0a70:
        if (bVar5) goto LAB_003b081f;
        goto LAB_003b0821;
      }
      break;
    case 5:
      if (cVar10 == '-') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        pfVar4 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_34);
          if (!bVar5) goto LAB_003b0a17;
        }
        else {
          local_34 = *pfVar4;
          input->buffer_ = (uint8 *)(pfVar4 + 1);
        }
        this->k_ = local_34;
        goto LAB_003b081f;
      }
      break;
    case 6:
      if (cVar10 == '0') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar12 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b0a20;
          input->buffer_ = pbVar2 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_003b0a20:
          uVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar12;
        }
        iVar8 = 6;
        if (bVar5) {
          uVar11 = (uint)uVar12;
          if (2 < uVar11) {
            pvVar3 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar3 & 1) == 0) {
              pUVar9 = google::protobuf::internal::
                       InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ::mutable_unknown_fields_slow
                                 (&this_00->
                                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                 );
            }
            else {
              pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
            }
            iVar8 = 6;
            goto LAB_003b0a68;
          }
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          this->engine_ = uVar11;
          goto LAB_003b0a6e;
        }
        goto LAB_003b0a70;
      }
    }
switchD_003b07cb_default:
    if ((uVar11 & 7) == 4 || uVar11 == 0) {
      iVar8 = 7;
    }
    else {
      pvVar3 = (this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        pUVar9 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ::mutable_unknown_fields_slow
                           (&this_00->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           );
      }
      else {
        pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar5 = google::protobuf::internal::WireFormat::SkipField(input,uVar11,pUVar9);
      iVar8 = 6;
      if (bVar5) {
LAB_003b081f:
        iVar8 = 0;
      }
    }
LAB_003b0821:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool LRNParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.LRNParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 local_size = 1 [default = 5];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_local_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &local_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float alpha = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_alpha();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &alpha_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float beta = 3 [default = 0.75];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_beta();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &beta_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LRNParameter.NormRegion norm_region = 4 [default = ACROSS_CHANNELS];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::LRNParameter_NormRegion_IsValid(value)) {
            set_norm_region(static_cast< ::caffe::LRNParameter_NormRegion >(value));
          } else {
            mutable_unknown_fields()->AddVarint(4, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float k = 5 [default = 1];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {
          set_has_k();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &k_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LRNParameter.Engine engine = 6 [default = DEFAULT];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::LRNParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::LRNParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(6, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.LRNParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.LRNParameter)
  return false;
#undef DO_
}